

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_join_dynamic_task_internal(Executor *this,Worker *w,Node *p,Graph *g)

{
  Worker *w_00;
  pointer ppNVar1;
  pointer ppNVar2;
  Node *n;
  SmallVector<tf::Node_*,_2U> src;
  Node *local_68;
  Worker *local_60;
  SmallVector<tf::Node_*,_2U> local_58;
  
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &stack0xffffffffffffffd0;
  ppNVar1 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar1 == ppNVar2) {
    if ((p->_join_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      return;
    }
    ppNVar1 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar2 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
       &local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  local_60 = w;
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
       local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
       super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  for (; w_00 = local_60, ppNVar1 != ppNVar2; ppNVar1 = ppNVar1 + 1) {
    local_68 = *ppNVar1;
    local_68->_topology = p->_topology;
    (local_68->_state).super___atomic_base<int>._M_i = 0;
    Node::_set_up_join_counter(local_68);
    local_68->_parent = p;
    if ((local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX ==
        (local_68->_dependents).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX) {
      SmallVectorTemplateBase<tf::Node_*,_true>::push_back
                ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_58,&local_68);
    }
  }
  LOCK();
  (p->_join_counter).super___atomic_base<unsigned_long>._M_i =
       (p->_join_counter).super___atomic_base<unsigned_long>._M_i +
       ((long)local_58.super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
        (long)local_58.super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3);
  UNLOCK();
  _schedule(this,local_60,&local_58);
  _consume_task(this,w_00,p);
  SmallVectorImpl<tf::Node_*>::~SmallVectorImpl(&local_58.super_SmallVectorImpl<tf::Node_*>);
  return;
}

Assistant:

inline void Executor::_join_dynamic_task_internal(
  Worker& w, Node* p, Graph& g
) {

  // graph is empty and has no async tasks
  if(g.empty() && p->_join_counter == 0) {
    return;
  }

  SmallVector<Node*> src;

  for(auto n : g._nodes) {
    n->_topology = p->_topology;
    n->_state.store(0, std::memory_order_relaxed);
    n->_set_up_join_counter();
    n->_parent = p;
    if(n->num_dependents() == 0) {
      src.push_back(n);
    }
  }
  p->_join_counter.fetch_add(src.size());
  _schedule(w, src);
  _consume_task(w, p);
}